

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O3

int __thiscall Fl_Browser_::handle(Fl_Browser_ *this,int event)

{
  uint *puVar1;
  uchar uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *pvVar10;
  void *pvVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  void *pvVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  fd_set *in_R8;
  fd_set *__exceptfds;
  timeval *in_R9;
  Fl_Widget_Tracker wp;
  int H;
  int Y;
  int W;
  int X;
  Fl_Widget_Tracker local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  Fl_Widget_Tracker::Fl_Widget_Tracker(&local_48,(Fl_Widget *)this);
  iVar9 = 1;
  if (event - 3U < 2) goto switchD_001a8749_caseD_3;
  if ((event == 8) && (bVar3 = (this->super_Fl_Group).super_Fl_Widget.type_, 1 < bVar3)) {
    pvVar10 = this->selection_;
    pvVar12 = pvVar10;
    if (pvVar10 == (void *)0x0) {
      pvVar12 = this->top_;
    }
    if (pvVar12 == (void *)0x0) {
      iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      pvVar12 = (void *)CONCAT44(extraout_var,iVar5);
      if (pvVar12 == (void *)0x0) goto LAB_001a86f2;
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.type_;
    }
    if (bVar3 != 2) {
      if (Fl::e_keysym < 0xff52) {
        if (Fl::e_keysym == 0x20) {
          this->selection_ = pvVar12;
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar12);
          select(this,(int)pvVar12,(fd_set *)(ulong)(iVar5 == 0),
                 (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 0xfffffff7),in_R8,
                 in_R9);
          goto switchD_001a8749_caseD_3;
        }
        if (Fl::e_keysym != 0xff0d) goto LAB_001a86f2;
      }
      else if (Fl::e_keysym != 0xff8d) {
        if (Fl::e_keysym == 0xff54) {
          do {
            iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar12);
            pvVar12 = (void *)CONCAT44(extraout_var_04,iVar5);
            if (pvVar12 == (void *)0x0) goto switchD_001a8749_caseD_3;
            if ((Fl::e_state & 0x50000U) != 0) {
              if (pvVar10 == (void *)0x0) {
                uVar6 = 1;
              }
              else {
                uVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])
                                  (this,pvVar10);
              }
              select(this,iVar5,(fd_set *)(ulong)uVar6,
                     (fd_set *)(ulong)(this->super_Fl_Group).super_Fl_Widget.when_,in_R8,in_R9);
            }
            if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001a8749_caseD_3;
            iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar12);
          } while (iVar5 < 1);
        }
        else {
          if (Fl::e_keysym != 0xff52) goto LAB_001a86f2;
          do {
            iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar12);
            pvVar12 = (void *)CONCAT44(extraout_var_02,iVar5);
            if (pvVar12 == (void *)0x0) goto switchD_001a8749_caseD_3;
            if ((Fl::e_state & 0x50000U) != 0) {
              if (pvVar10 == (void *)0x0) {
                uVar6 = 1;
              }
              else {
                uVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])
                                  (this,pvVar10);
              }
              select(this,iVar5,(fd_set *)(ulong)uVar6,
                     (fd_set *)(ulong)(this->super_Fl_Group).super_Fl_Widget.when_,in_R8,in_R9);
            }
            if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001a8749_caseD_3;
            iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar12);
          } while (iVar5 < 1);
        }
        if (this->selection_ != (void *)0x0) {
          redraw_line(this,this->selection_);
        }
        this->selection_ = pvVar12;
        redraw_line(this,pvVar12);
        display(this,pvVar12);
        goto switchD_001a8749_caseD_3;
      }
      select_only(this,pvVar12,(this->super_Fl_Group).super_Fl_Widget.when_ & 0xfffffff7);
      if ((local_48.wp_ != (Fl_Widget *)0x0) &&
         (((this->super_Fl_Group).super_Fl_Widget.when_ & 8) != 0)) {
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
        *(byte *)puVar1 = (byte)*puVar1 | 0x80;
        Fl_Widget::do_callback
                  ((Fl_Widget *)this,(Fl_Widget *)this,
                   (this->super_Fl_Group).super_Fl_Widget.user_data_);
      }
      goto switchD_001a8749_caseD_3;
    }
    if (Fl::e_keysym == 0xff54) {
      do {
        iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar12);
        pvVar12 = (void *)CONCAT44(extraout_var_01,iVar5);
        if (pvVar12 == (void *)0x0) goto switchD_001a8749_caseD_3;
        iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar12);
      } while (iVar5 < 1);
    }
    else {
      if (Fl::e_keysym != 0xff52) goto LAB_001a86f2;
      do {
        iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xc])(this,pvVar12);
        pvVar12 = (void *)CONCAT44(extraout_var_00,iVar5);
        if (pvVar12 == (void *)0x0) goto switchD_001a8749_caseD_3;
        iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar12);
      } while (iVar5 < 1);
    }
    select_only(this,pvVar12,(uint)(this->super_Fl_Group).super_Fl_Widget.when_);
    goto switchD_001a8749_caseD_3;
  }
LAB_001a86f2:
  iVar5 = Fl_Group::handle(&this->super_Fl_Group,event);
  if ((iVar5 != 0) || (local_48.wp_ == (Fl_Widget *)0x0)) goto switchD_001a8749_caseD_3;
  __exceptfds = (fd_set *)&stack0xffffffffffffffc0;
  bbox(this,&stack0xffffffffffffffcc,&stack0xffffffffffffffc4,&stack0xffffffffffffffc8,
       (int *)__exceptfds);
  iVar5 = Fl::e_y;
  iVar9 = 0;
  switch(event) {
  case 1:
    iVar5 = Fl::event_inside(local_34,local_3c,local_38,local_40);
    iVar9 = 0;
    if (iVar5 == 0) break;
    bVar4 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar4) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    handle::py = Fl::e_y;
    handle::change = '\0';
    uVar2 = (this->super_Fl_Group).super_Fl_Widget.type_;
    iVar9 = 1;
    if ((uVar2 == '\0') || (this->top_ == (void *)0x0)) break;
    if (uVar2 != '\x03') {
      pvVar10 = find_item(this,Fl::e_y);
      iVar5 = select_only(this,pvVar10,0);
      handle::change = (char)iVar5;
      if ((handle::change == '\0') || (local_48.wp_ == (Fl_Widget *)0x0)) break;
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 1;
      goto joined_r0x001a89f2;
    }
    pvVar10 = find_item(this,Fl::e_y);
    handle::whichway = '\x01';
    if (((uint)Fl::e_state >> 0x12 & 1) == 0) {
      if (((uint)Fl::e_state >> 0x10 & 1) != 0) {
        pvVar12 = this->selection_;
        if (pvVar10 != pvVar12) {
          if (pvVar10 != (void *)0x0) {
            iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar10);
            handle::whichway = iVar5 == 0;
            pvVar12 = this->selection_;
            while (pvVar12 != pvVar10) {
              if (pvVar12 == (void *)0x0) {
                pvVar12 = this->selection_;
                iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar10)
                ;
                pvVar11 = (void *)CONCAT44(extraout_var_09,iVar5);
                goto LAB_001a8d4d;
              }
              iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar12);
              pvVar12 = (void *)CONCAT44(extraout_var_07,iVar5);
            }
            pvVar12 = this->selection_;
          }
          while (pvVar12 != pvVar10) {
            select(this,(int)pvVar12,(fd_set *)(ulong)(byte)handle::whichway,
                   (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 1),__exceptfds,
                   in_R9);
            if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001a8749_caseD_3;
            iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar12);
            pvVar12 = (void *)CONCAT44(extraout_var_08,iVar5);
          }
LAB_001a8d8c:
          handle::change = '\x01';
          if (pvVar10 != (void *)0x0) {
            select(this,(int)pvVar10,(fd_set *)(ulong)(byte)handle::whichway,
                   (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 1),__exceptfds,
                   in_R9);
          }
          break;
        }
        goto LAB_001a8c84;
      }
      iVar5 = select_only(this,pvVar10,0);
      handle::change = (char)iVar5;
      if (handle::change == '\0') break;
    }
    else {
LAB_001a8c84:
      if (pvVar10 == (void *)0x0) break;
      iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar10);
      handle::whichway = iVar5 == 0;
      iVar5 = select(this,(int)pvVar10,(fd_set *)(ulong)(byte)handle::whichway,(fd_set *)0x0,
                     __exceptfds,in_R9);
      handle::change = (char)iVar5;
      if (iVar5 == 0) break;
    }
    if ((local_48.wp_ != (Fl_Widget *)0x0) &&
       (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
      puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
    }
    break;
  case 2:
    if ((this->super_Fl_Group).super_Fl_Widget.type_ == '\x01') {
      pvVar10 = this->selection_;
      deselect(this,0);
      if (local_48.wp_ == (Fl_Widget *)0x0) goto LAB_001a8c26;
      this->selection_ = pvVar10;
    }
    if (handle::change == '\0') {
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 2;
    }
    else {
      puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 4;
    }
    if (bVar3 != 0) {
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
    }
    iVar9 = 1;
    if ((local_48.wp_ == (Fl_Widget *)0x0) || (Fl::e_clicks == 0)) break;
    bVar3 = (this->super_Fl_Group).super_Fl_Widget.when_ & 8;
joined_r0x001a89f2:
    iVar9 = 1;
    if (bVar3 != 0) {
      puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
      iVar9 = 1;
    }
    break;
  case 5:
    if (Fl::e_y < handle::py && Fl::e_y < local_3c) {
      iVar7 = (Fl::e_y - local_3c) + this->real_position_;
      iVar9 = 0;
      if (0 < iVar7) {
        iVar9 = iVar7;
      }
      if ((iVar9 != this->position_) && (this->position_ = iVar9, iVar9 != this->real_position_)) {
        Fl_Widget::damage((Fl_Widget *)this,'\x04');
      }
    }
    else {
      iVar9 = Fl::e_y - (local_3c + local_40);
      if (handle::py < Fl::e_y && (iVar9 != 0 && local_3c + local_40 <= Fl::e_y)) {
        iVar7 = this->real_position_;
        iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
        iVar9 = iVar9 + iVar7;
        iVar7 = iVar8 - local_40;
        if (iVar9 < iVar8 - local_40) {
          iVar7 = iVar9;
        }
        iVar9 = 0;
        if (0 < iVar7) {
          iVar9 = iVar7;
        }
        if ((iVar9 != this->position_) && (this->position_ = iVar9, iVar9 != this->real_position_))
        {
          Fl_Widget::damage((Fl_Widget *)this,'\x04');
        }
      }
    }
    uVar2 = (this->super_Fl_Group).super_Fl_Widget.type_;
    if ((uVar2 != '\0') && (this->top_ != (void *)0x0)) {
      if (uVar2 == '\x03') {
        pvVar11 = find_item(this,iVar5);
        pvVar10 = this->selection_;
        pvVar12 = pvVar11;
        if (handle::py < iVar5) {
          if (pvVar10 == (void *)0x0) {
            pvVar12 = (void *)0x0;
          }
          else {
            iVar9 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar10);
            pvVar12 = (void *)CONCAT44(extraout_var_03,iVar9);
          }
          if (pvVar11 == (void *)0x0) {
            pvVar10 = (void *)0x0;
          }
          else {
            iVar9 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar11);
            pvVar10 = (void *)CONCAT44(extraout_var_05,iVar9);
          }
        }
        while ((pvVar12 != (void *)0x0 && (pvVar12 != pvVar10))) {
          iVar7 = select(this,(int)pvVar12,(fd_set *)(ulong)(byte)handle::whichway,(fd_set *)0x0,
                         __exceptfds,in_R9);
          iVar9 = 1;
          if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001a8749_caseD_3;
          handle::change = handle::change | (byte)iVar7;
          if ((iVar7 != 0) && (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
            puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
            *(byte *)puVar1 = (byte)*puVar1 | 0x80;
            Fl_Widget::do_callback
                      ((Fl_Widget *)this,(Fl_Widget *)this,
                       (this->super_Fl_Group).super_Fl_Widget.user_data_);
            if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001a8749_caseD_3;
          }
          iVar9 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar12);
          pvVar12 = (void *)CONCAT44(extraout_var_06,iVar9);
        }
        if (pvVar11 != (void *)0x0) {
          this->selection_ = pvVar11;
        }
      }
      else {
        pvVar10 = this->selection_;
        iVar9 = (this->super_Fl_Group).super_Fl_Widget.x_;
        pvVar12 = pvVar10;
        if ((iVar9 <= Fl::e_x) && (Fl::e_x <= iVar9 + (this->super_Fl_Group).super_Fl_Widget.w_)) {
          pvVar12 = find_item(this,iVar5);
        }
        handle::change = pvVar12 != pvVar10;
        select_only(this,pvVar12,(this->super_Fl_Group).super_Fl_Widget.when_ & 1);
        if (local_48.wp_ == (Fl_Widget *)0x0) goto LAB_001a8c26;
      }
    }
    handle::py = iVar5;
LAB_001a8c26:
    iVar9 = 1;
    break;
  case 6:
  case 7:
    if ((1 < (this->super_Fl_Group).super_Fl_Widget.type_) &&
       (bVar4 = Fl::option(OPTION_VISIBLE_FOCUS), iVar9 = 0, bVar4)) {
      Fl_Widget::redraw((Fl_Widget *)this);
      iVar9 = 1;
    }
  }
switchD_001a8749_caseD_3:
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_48);
  return iVar9;
LAB_001a8d4d:
  if (pvVar11 == (void *)0x0) goto LAB_001a8d8c;
  select(this,(int)pvVar11,(fd_set *)(ulong)(byte)handle::whichway,
         (fd_set *)(ulong)((this->super_Fl_Group).super_Fl_Widget.when_ & 1),__exceptfds,in_R9);
  if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001a8749_caseD_3;
  if (pvVar11 == pvVar12) goto LAB_001a8d8c;
  iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar11);
  pvVar11 = (void *)CONCAT44(extraout_var_10,iVar5);
  goto LAB_001a8d4d;
}

Assistant:

int Fl_Browser_::handle(int event) {

  // NOTE:
  // We use Fl_Widget_Tracker to test if the user has deleted
  // this widget in a callback. Callbacks can be called by:
  //  - do_callback()
  //  - select()
  //  - select_only()
  //  - deselect()
  // Thus we must test wp.deleted() after each of these calls,
  // unless we return directly after one of these.
  // If wp.deleted() is true, we return 1 because we used the event.

  Fl_Widget_Tracker wp(this);

  // must do shortcuts first or the scrollbar will get them...
  if (event == FL_ENTER || event == FL_LEAVE) return 1;
  if (event == FL_KEYBOARD && type() >= FL_HOLD_BROWSER) {
    void* l1 = selection_;
    void* l = l1; if (!l) l = top_; if (!l) l = item_first();
    if (l) {
      if (type()==FL_HOLD_BROWSER) {
        switch (Fl::event_key()) {
        case FL_Down:
	  while ((l = item_next(l))) {
	    if (item_height(l)>0) {select_only(l, when()); break;}
	  }
	  return 1;
        case FL_Up:
          while ((l = item_prev(l))) {
	    if (item_height(l)>0) {
	      select_only(l, when());
	      break; // no need to test wp (return 1)
	    }
	  }
          return 1;
        } 
      } else  {
        switch (Fl::event_key()) {
        case FL_Enter:
        case FL_KP_Enter:
          select_only(l, when() & ~FL_WHEN_ENTER_KEY);
	  if (wp.deleted()) return 1;
	  if (when() & FL_WHEN_ENTER_KEY) {
	    set_changed();
	    do_callback();
	  }
          return 1;
        case ' ':
          selection_ = l;
          select(l, !item_selected(l), when() & ~FL_WHEN_ENTER_KEY);
          return 1;
        case FL_Down:
          while ((l = item_next(l))) {
            if (Fl::event_state(FL_SHIFT|FL_CTRL))
              select(l, l1 ? item_selected(l1) : 1, when());
	    if (wp.deleted()) return 1;
            if (item_height(l)>0) goto J1;
          }
          return 1;
        case FL_Up:
          while ((l = item_prev(l))) {
            if (Fl::event_state(FL_SHIFT|FL_CTRL))
              select(l, l1 ? item_selected(l1) : 1, when());
	    if (wp.deleted()) return 1;
            if (item_height(l)>0) goto J1;
          }
          return 1;
J1:
          if (selection_) redraw_line(selection_);
          selection_ = l; redraw_line(l);
          display(l);
          return 1;
        }
      }
    }
  }
  
  if (Fl_Group::handle(event)) return 1;
  if (wp.deleted()) return 1;

  int X, Y, W, H; bbox(X, Y, W, H);
  int my;
// NOTE:
// instead of:
//     change = select_only(find_item(my), when() & FL_WHEN_CHANGED)
// we use the construct:
//     change = select_only(find_item(my), 0);
//     if (change && (when() & FL_WHEN_CHANGED)) {
//	 set_changed();
//       do_callback();
//     }
// See str #834
// The first form calls the callback *before* setting change.
// The callback may execute an Fl::wait(), resulting in another
// call of Fl_Browser_::handle() for the same widget. The sequence
// of events can be an FL_PUSH followed by an FL_RELEASE.
// This second call of Fl_Browser_::handle() may result in a -
// somewhat unexpected - second concurrent invocation of the callback.

  static char change;
  static char whichway;
  static int py;
  switch (event) {
  case FL_PUSH:
    if (!Fl::event_inside(X, Y, W, H)) return 0;
    if (Fl::visible_focus()) {
      Fl::focus(this);
      redraw();
    }
    my = py = Fl::event_y();
    change = 0;
    if (type() == FL_NORMAL_BROWSER || !top_)
      ;
    else if (type() != FL_MULTI_BROWSER) {
      change = select_only(find_item(my), 0);
      if (wp.deleted()) return 1;
      if (change && (when() & FL_WHEN_CHANGED)) {
	set_changed();
	do_callback();
	if (wp.deleted()) return 1;
      }
    } else {
      void* l = find_item(my);
      whichway = 1;
      if (Fl::event_state(FL_COMMAND)) { // toggle selection:
      TOGGLE:
	if (l) {
	  whichway = !item_selected(l);
	  change = select(l, whichway, 0);
	  if (wp.deleted()) return 1;
	  if (change && (when() & FL_WHEN_CHANGED)) {
	    set_changed();
	    do_callback();
	    if (wp.deleted()) return 1;
	  }
	}
      } else if (Fl::event_state(FL_SHIFT)) { // extend selection:
	if (l == selection_) goto TOGGLE;
	// state of previous selection determines new value:
	whichway = l ? !item_selected(l) : 1;
	// see which of the new item or previous selection is earlier,
	// by searching from the previous forward for this one:
	int down;
	if (!l) down = 1;
	else {for (void* m = selection_; ; m = item_next(m)) {
	  if (m == l) {down = 1; break;}
	  if (!m) {down = 0; break;}
	}}
	if (down) {
	  for (void* m = selection_; m != l; m = item_next(m)) {
	    select(m, whichway, when() & FL_WHEN_CHANGED);
	    if (wp.deleted()) return 1;
	  }
	} else {
	  void* e = selection_;
	  for (void* m = item_next(l); m; m = item_next(m)) {
	    select(m, whichway, when() & FL_WHEN_CHANGED);
	    if (wp.deleted()) return 1;
	    if (m == e) break;
	  }
	}
	// do the clicked item last so the select box is around it:
	change = 1;
	if (l) select(l, whichway, when() & FL_WHEN_CHANGED);
	if (wp.deleted()) return 1;
      } else { // select only this item
	change = select_only(l, 0);
	if (wp.deleted()) return 1;
	if (change && (when() & FL_WHEN_CHANGED)) {
	  set_changed();
	  do_callback();
	  if (wp.deleted()) return 1;
	}
      }
    }
    return 1;
  case FL_DRAG:
    // do the scrolling first:
    my = Fl::event_y();
    if (my < Y && my < py) {
      int p = real_position_+my-Y;
      if (p<0) p = 0;
      position(p);
    } else if (my > (Y+H) && my > py) {
      int p = real_position_+my-(Y+H);
      int hh = full_height()-H; if (p > hh) p = hh;
      if (p<0) p = 0;
      position(p);
    }
    if (type() == FL_NORMAL_BROWSER || !top_)
      ;
    else if (type() == FL_MULTI_BROWSER) {
      void* l = find_item(my);
      void* t; void* b; // this will be the range to change
      if (my > py) { // go down
	t = selection_ ? item_next(selection_) : 0;
	b = l ? item_next(l) : 0;
      } else {	// go up
	t = l;
	b = selection_;
      }
      for (; t && t != b; t = item_next(t)) {
	char change_t;
	change_t = select(t, whichway, 0);
	if (wp.deleted()) return 1;
	change |= change_t;
	if (change_t && (when() & FL_WHEN_CHANGED)) {
	  set_changed();
	  do_callback();
	  if (wp.deleted()) return 1;
	}
      }
      if (l) selection_ = l;
    } else {
      void* l1 = selection_;
      void* l =
	(Fl::event_x()<x() || Fl::event_x()>x()+w()) ? selection_ :
	find_item(my);
      change = (l != l1);
      select_only(l, when() & FL_WHEN_CHANGED);
      if (wp.deleted()) return 1;
    }
    py = my;
    return 1;
  case FL_RELEASE:
    if (type() == FL_SELECT_BROWSER) {
      void* t = selection_;
      deselect();
      if (wp.deleted()) return 1;
      selection_ = t;
    }
    if (change) {
      set_changed();
      if (when() & FL_WHEN_RELEASE) do_callback();
    } else {
      if (when() & FL_WHEN_NOT_CHANGED) do_callback();
    }
    if (wp.deleted()) return 1;

    // double click calls the callback: (like Enter Key)
    if (Fl::event_clicks() && (when() & FL_WHEN_ENTER_KEY)) {
      set_changed();
      do_callback();
    }
    return 1;
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (type() >= FL_HOLD_BROWSER && Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  }

  return 0;
}